

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

bool __thiscall
VmaBlockBufferImageGranularity::FinishValidation
          (VmaBlockBufferImageGranularity *this,ValidationContext *ctx)

{
  long lVar1;
  uint uVar2;
  uint16_t *__ptr;
  VkAllocationCallbacks *pVVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  if (0x100 < this->m_BufferImageGranularity) {
    uVar2 = this->m_RegionCount;
    bVar7 = uVar2 != 0;
    if (bVar7) {
      if (*ctx->pageAllocs == this->m_RegionInfo->allocCount) {
        lVar6 = 0;
        do {
          if (uVar2 - 1 == (int)lVar6) goto LAB_001b9a00;
          lVar4 = lVar6 + 1;
          lVar1 = lVar6 + 1;
          lVar5 = lVar6 + 1;
          lVar6 = lVar1;
        } while (ctx->pageAllocs[lVar4] == this->m_RegionInfo[lVar5].allocCount);
        bVar7 = (uint)lVar1 < uVar2;
      }
      if (bVar7) {
        return false;
      }
    }
LAB_001b9a00:
    __ptr = ctx->pageAllocs;
    if (__ptr != (uint16_t *)0x0) {
      pVVar3 = ctx->allocCallbacks;
      if ((pVVar3 == (VkAllocationCallbacks *)0x0) || (pVVar3->pfnFree == (PFN_vkFreeFunction)0x0))
      {
        free(__ptr);
      }
      else {
        (*pVVar3->pfnFree)(pVVar3->pUserData,__ptr);
      }
    }
    ctx->pageAllocs = (uint16_t *)0x0;
  }
  return true;
}

Assistant:

bool VmaBlockBufferImageGranularity::FinishValidation(ValidationContext& ctx) const
{
    // Check proper page structure
    if (IsEnabled())
    {
        VMA_ASSERT(ctx.pageAllocs != VMA_NULL && "Validation context not initialized!");

        for (uint32_t page = 0; page < m_RegionCount; ++page)
        {
            VMA_VALIDATE(ctx.pageAllocs[page] == m_RegionInfo[page].allocCount);
        }
        vma_delete_array(ctx.allocCallbacks, ctx.pageAllocs, m_RegionCount);
        ctx.pageAllocs = VMA_NULL;
    }
    return true;
}